

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O3

int32_t __thiscall icu_63::RuleBasedTimeZone::getRawOffset(RuleBasedTimeZone *this)

{
  UDate UVar1;
  int32_t dst;
  int32_t raw;
  UErrorCode status;
  undefined1 local_24 [4];
  int32_t local_20 [2];
  
  local_20[1] = 0;
  UVar1 = uprv_getUTCtime_63();
  (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[6])
            (UVar1 * 1000.0,this,0,local_20,local_24,local_20 + 1);
  return local_20[0];
}

Assistant:

int32_t
RuleBasedTimeZone::getRawOffset(void) const {
    // Note: This implementation returns standard GMT offset
    // as of current time.
    UErrorCode status = U_ZERO_ERROR;
    int32_t raw, dst;
    getOffset(uprv_getUTCtime() * U_MILLIS_PER_SECOND,
        FALSE, raw, dst, status);
    return raw;
}